

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpheaders.c
# Opt level: O0

HTTP_HEADERS_RESULT HTTPHeaders_GetHeaderCount(HTTP_HEADERS_HANDLE handle,size_t *headerCount)

{
  MAP_RESULT MVar1;
  HTTP_HEADERS_HANDLE_DATA *pHVar2;
  char *pcVar3;
  LOGGER_LOG p_Var4;
  LOGGER_LOG l_1;
  char **values;
  char **keys;
  HTTP_HEADERS_HANDLE_DATA *handleData;
  LOGGER_LOG l;
  size_t *psStack_20;
  HTTP_HEADERS_RESULT result;
  size_t *headerCount_local;
  HTTP_HEADERS_HANDLE handle_local;
  
  psStack_20 = headerCount;
  headerCount_local = (size_t *)handle;
  if ((handle == (HTTP_HEADERS_HANDLE)0x0) || (headerCount == (size_t *)0x0)) {
    l._4_4_ = HTTP_HEADERS_INVALID_ARG;
    pHVar2 = (HTTP_HEADERS_HANDLE_DATA *)xlogging_get_log_function();
    if (pHVar2 != (HTTP_HEADERS_HANDLE_DATA *)0x0) {
      handleData = pHVar2;
      pcVar3 = HTTP_HEADERS_RESULTStrings(l._4_4_);
      (*(code *)pHVar2)(0,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/httpheaders.c"
                        ,"HTTPHeaders_GetHeaderCount",0xda,1,"(result = %s%s (%d))","",pcVar3,
                        l._4_4_);
    }
  }
  else {
    keys = (char **)handle;
    MVar1 = Map_GetInternals(handle->headers,&values,(char ***)&l_1,headerCount);
    if (MVar1 == MAP_OK) {
      l._4_4_ = HTTP_HEADERS_OK;
    }
    else {
      l._4_4_ = HTTP_HEADERS_ERROR;
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        pcVar3 = HTTP_HEADERS_RESULTStrings(l._4_4_);
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/httpheaders.c"
                  ,"HTTPHeaders_GetHeaderCount",0xe6,1,"Map_GetInternals failed, result= %s%s (%d)",
                  "",pcVar3,l._4_4_);
      }
    }
  }
  return l._4_4_;
}

Assistant:

HTTP_HEADERS_RESULT HTTPHeaders_GetHeaderCount(HTTP_HEADERS_HANDLE handle, size_t* headerCount)
{
    HTTP_HEADERS_RESULT result;
    /*Codes_SRS_HTTP_HEADERS_99_024:[ The function shall return HTTP_HEADERS_INVALID_ARG when an invalid handle is passed.]*/
    /*Codes_SRS_HTTP_HEADERS_99_025:[ The function shall return HTTP_HEADERS_INVALID_ARG when headersCount is NULL.]*/
    if ((handle == NULL) ||
        (headerCount == NULL))
    {
        result = HTTP_HEADERS_INVALID_ARG;
        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTP_HEADERS_RESULT, result));
    }
    else
    {
        HTTP_HEADERS_HANDLE_DATA *handleData = (HTTP_HEADERS_HANDLE_DATA *)handle;
        const char*const* keys;
        const char*const* values;
        /*Codes_SRS_HTTP_HEADERS_99_023:[ Calling this API shall provide the number of stored headers.]*/
        if (Map_GetInternals(handleData->headers, &keys, &values, headerCount) != MAP_OK)
        {
            /*Codes_SRS_HTTP_HEADERS_99_037:[ The function shall return HTTP_HEADERS_ERROR when an internal error occurs.]*/
            result = HTTP_HEADERS_ERROR;
            LogError("Map_GetInternals failed, result= %" PRI_MU_ENUM "", MU_ENUM_VALUE(HTTP_HEADERS_RESULT, result));
        }
        else
        {
            /*Codes_SRS_HTTP_HEADERS_99_026:[ The function shall write in *headersCount the number of currently stored headers and shall return HTTP_HEADERS_OK]*/
            result = HTTP_HEADERS_OK;
        }
    }

    return result;
}